

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSpecsOf.hpp
# Opt level: O2

GridSpecsBase * __thiscall
sciplot::LineSpecsOf<sciplot::GridSpecsBase>::lineType
          (LineSpecsOf<sciplot::GridSpecsBase> *this,int value)

{
  int local_54;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_54 = value;
  internal::str<int>(&local_50,&local_54);
  std::operator+(&local_30,"linetype ",&local_50);
  std::__cxx11::string::operator=((string *)&this->m_linetype,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return (GridSpecsBase *)this;
}

Assistant:

auto LineSpecsOf<DerivedSpecs>::lineType(int value) -> DerivedSpecs&
{
    m_linetype = "linetype " + internal::str(value);
    return static_cast<DerivedSpecs&>(*this);
}